

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FluxTrackBuilder::buffer(FluxTrackBuilder *this)

{
  iterator __position;
  
  if (this->m_flux_time != 0) {
    __position._M_current =
         (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_flux_times,__position
                 ,&this->m_flux_time);
    }
    else {
      *__position._M_current = this->m_flux_time;
      (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->m_flux_time = 0;
  }
  return &this->m_flux_times;
}

Assistant:

std::vector<uint32_t>& FluxTrackBuilder::buffer()
{
    // Flush any buffered time with a transition.
    if (m_flux_time)
    {
        m_flux_times.push_back(m_flux_time);
        m_flux_time = 0;
    }

    return m_flux_times;
}